

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_pathops.cc
# Opt level: O1

string * ctemplate::PathJoin(string *__return_storage_ptr__,string *a,string *b)

{
  size_type sVar1;
  size_type sVar2;
  long lVar3;
  long *plVar4;
  size_type *psVar5;
  pointer pcVar6;
  pointer pcVar7;
  __string_type __str;
  undefined1 *local_40;
  ulong local_38;
  undefined1 local_30 [16];
  
  sVar1 = b->_M_string_length;
  if (sVar1 == 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar7 = (a->_M_dataplus)._M_p;
    pcVar6 = pcVar7 + a->_M_string_length;
  }
  else {
    sVar2 = a->_M_string_length;
    if ((sVar2 != 0) && (*(b->_M_dataplus)._M_p != '/')) {
      if ((a->_M_dataplus)._M_p[sVar2 - 1] == '/') {
        std::operator+(__return_storage_ptr__,a,b);
        return __return_storage_ptr__;
      }
      pcVar7 = (a->_M_dataplus)._M_p;
      local_40 = local_30;
      std::__cxx11::string::_M_construct<char*>((string *)&local_40,pcVar7,pcVar7 + sVar2);
      std::__cxx11::string::_M_replace_aux((ulong)&local_40,local_38,0,'\x01');
      plVar4 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_40,(ulong)(b->_M_dataplus)._M_p);
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      psVar5 = (size_type *)(plVar4 + 2);
      if ((size_type *)*plVar4 == psVar5) {
        lVar3 = plVar4[3];
        (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar5;
        *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar3;
      }
      else {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar4;
        (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar5;
      }
      __return_storage_ptr__->_M_string_length = plVar4[1];
      *plVar4 = (long)psVar5;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      if (local_40 == local_30) {
        return __return_storage_ptr__;
      }
      operator_delete(local_40);
      return __return_storage_ptr__;
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar7 = (b->_M_dataplus)._M_p;
    pcVar6 = pcVar7 + sVar1;
  }
  std::__cxx11::string::_M_construct<char*>((string *)__return_storage_ptr__,pcVar7,pcVar6);
  return __return_storage_ptr__;
}

Assistant:

string PathJoin(const string& a, const string& b) {
  if (b.empty()) return a;                        // degenerate case 1
  if (a.empty()) return b;                        // degenerate case 2
  if (IsAbspath(b)) return b;                     // absolute path
  if (IsDirectory(a)) return a + b;               // 'well-formed' case
  return a + PATH_SEP + b;
}